

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_nonpremul_rgba
               (QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color)

{
  uint *dest;
  uint uVar1;
  long in_FS_OFFSET;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dest = (uint *)rasterBuffer->m_buffer;
  local_40 = QRgba64::unpremultiplied(color);
  uVar1 = QRgba64::toArgb32(&local_40);
  qt_rectfill<unsigned_int>
            (dest,(uVar1 & 0xff00ff) << 0x10 | uVar1 & 0xff00ff00 | (uVar1 & 0xff00ff) >> 0x10,x,y,
             width,height,rasterBuffer->bytes_per_line);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_nonpremul_rgba(QRasterBuffer *rasterBuffer,
                                       int x, int y, int width, int height,
                                       const QRgba64 &color)
{
    qt_rectfill<quint32>(reinterpret_cast<quint32 *>(rasterBuffer->buffer()),
                         ARGB2RGBA(color.unpremultiplied().toArgb32()), x, y, width, height, rasterBuffer->bytesPerLine());
}